

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O1

bool duckdb::ClampSlice<duckdb::string_t,long,duckdb::StringSliceOperations>
               (string_t *value,long *begin,long *end)

{
  long lVar1;
  bool bVar2;
  int64_t iVar3;
  long lVar4;
  int64_t iVar5;
  ulong uVar6;
  
  uVar6 = *begin;
  if ((uVar6 & 0x7fffffffffffffff) != 0) {
    uVar6 = uVar6 - 1;
  }
  *begin = uVar6;
  iVar3 = StringSliceOperations::ValueLength(value);
  lVar4 = *begin;
  bVar2 = SBORROW8(iVar3,-lVar4) != iVar3 + lVar4 < 0;
  if (bVar2 && lVar4 < 0) {
    lVar1 = *end;
    if (SBORROW8(lVar1,-iVar3) != lVar1 + iVar3 < 0 && lVar1 < 0) {
      *begin = 0;
      lVar4 = 0;
      goto LAB_0069644a;
    }
    if (bVar2 && lVar4 < 0) {
      *begin = 0;
    }
  }
  lVar4 = *begin;
  if (lVar4 < 0) {
    iVar5 = lVar4 + iVar3 + (ulong)(uVar6 != 0x8000000000000000);
LAB_00696422:
    *begin = iVar5;
  }
  else {
    iVar5 = iVar3;
    if (iVar3 < lVar4) goto LAB_00696422;
  }
  lVar4 = *end;
  if (lVar4 < 0) {
    iVar3 = iVar3 + lVar4 + 1;
LAB_0069643a:
    *end = iVar3;
  }
  else if (iVar3 < lVar4) goto LAB_0069643a;
  lVar4 = *end;
  if (*end < *begin) {
    lVar4 = *begin;
  }
LAB_0069644a:
  *end = lVar4;
  return SUB81(lVar4,0);
}

Assistant:

static bool ClampSlice(const INPUT_TYPE &value, INDEX_TYPE &begin, INDEX_TYPE &end) {
	// Clamp offsets
	begin = (begin != 0 && begin != (INDEX_TYPE)NumericLimits<int64_t>::Minimum()) ? begin - 1 : begin;

	bool is_min = false;
	if (begin == (INDEX_TYPE)NumericLimits<int64_t>::Minimum()) {
		begin++;
		is_min = true;
	}

	const auto length = OP::ValueLength(value);
	if (begin < 0 && -begin > length && end < 0 && end < -length) {
		begin = 0;
		end = 0;
		return true;
	}
	if (begin < 0 && -begin > length) {
		begin = 0;
	}
	ClampIndex(begin, value, length, is_min);
	ClampIndex(end, value, length, false);
	end = MaxValue<INDEX_TYPE>(begin, end);

	return true;
}